

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
* anon_unknown.dwarf_147e942::ParsePubkeyInner
            (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             *__return_storage_ptr__,uint32_t key_exp_index,Span<const_char> *sp,
            ParseScriptContext ctx,FlatSigningProvider *out,bool *apostrophe,string *error)

{
  char *__s1;
  size_t sVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  pointer puVar4;
  tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  __src;
  void *pvVar5;
  pointer pSVar6;
  pointer puVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  __uniq_ptr_impl<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  _Var11;
  ulong uVar12;
  pointer puVar13;
  tuple<(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  tVar14;
  pointer pvVar15;
  undefined8 uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  long lVar18;
  ulong uVar19;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *pvVar20;
  pointer puVar21;
  iter_difference_t<const_char_*> __d1;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
  *pvVar22;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *this;
  undefined4 *puVar23;
  CExtPubKey *pCVar24;
  SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *this_00;
  pointer pvVar25;
  pointer *__ptr;
  pointer puVar26;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view separators;
  string_view str_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  paths;
  uchar fullkey [33];
  CExtPubKey extpubkey;
  CExtKey extkey;
  string str;
  uint32_t local_1f4;
  pointer local_1f0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1d8;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> local_1c0;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_1a8;
  undefined1 local_188 [32];
  uchar local_168;
  uchar local_167 [79];
  uchar local_118;
  CExtPubKey local_10c;
  undefined1 local_98 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [2];
  undefined1 local_68 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_60;
  string local_58;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1a8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10c.version[0] = 0x2f;
  separators._M_str = (char *)out;
  separators._M_len = (size_t)&local_10c;
  util::Split<Span<char_const>>(&local_1c0,(util *)sp,(Span<const_char> *)0x1,separators);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             (local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data,
             (local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data +
             (local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_size);
  if (local_58._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (error,0,error->_M_string_length,"No key provided",0xf);
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_003a02c2;
  }
  if ((long)local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x10) {
    str_00._M_str = local_58._M_dataplus._M_p;
    str_00._M_len = local_58._M_string_length;
    bVar8 = IsHex(str_00);
    if (bVar8) {
      hex_str._M_str = local_58._M_dataplus._M_p;
      hex_str._M_len = local_58._M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,hex_str);
      CPubKey::Set<unsigned_char_const*>
                ((CPubKey *)&local_10c,(uchar *)CONCAT71(local_98._1_7_,local_98[0]),
                 (uchar *)local_90._M_t.
                          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                          _M_head_impl);
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ulong)local_10c.version[0];
      bVar9 = 1;
      pvVar22 = (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                 *)__return_storage_ptr__;
      if ((local_10c.version[0] & 0xfe) == 2) {
LAB_003a0090:
        bVar8 = (byte)(local_10c.version[0] - 2) < 3;
        pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)bVar8;
        if ((bVar8 & bVar9) != 0) goto LAB_003a00a1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (error,0,error->_M_string_length,"Hybrid public keys are not allowed",0x22);
LAB_003a016f:
        *(undefined8 *)pvVar22 = 0;
        *(undefined8 *)(pvVar22 + 8) = 0;
        *(undefined8 *)(pvVar22 + 0x10) = 0;
      }
      else {
        if ((local_10c.version[0] < 8) && ((0xd0U >> (local_10c.version[0] & 0x1f) & 1) != 0)) {
          if ((local_10c.version[0] & 0xfe) != 2) {
            if (local_10c.version[0] < 8) {
              bVar9 = 0xd0 >> (local_10c.version[0] & 0x1f);
            }
            else {
              bVar9 = 0;
            }
          }
          goto LAB_003a0090;
        }
LAB_003a00a1:
        bVar8 = CPubKey::IsFullyValid((CPubKey *)&local_10c);
        if (bVar8) {
          if ((ctx < P2WPKH) || ((local_10c.version[0] & 0xfe) == 2)) {
            tVar14.
            super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
            .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>._M_head_impl
                 = (_Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                    )operator_new(0x50);
            *(uint32_t *)
             ((long)tVar14.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                    _M_head_impl + 8) = key_exp_index;
            *(undefined ***)
             tVar14.
             super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
             .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
             _M_head_impl = &PTR__PubkeyProvider_006cbc10;
            memcpy((void *)((long)tVar14.
                                  super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                                  .
                                  super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>
                                  ._M_head_impl + 0xc),&local_10c,0x41);
            *(bool *)((long)tVar14.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                            .
                            super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>
                            ._M_head_impl + 0x4d) = false;
            local_188._0_8_ =
                 tVar14.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                 _M_head_impl;
            std::
            vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
            ::
            emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                      ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                        *)&local_1a8,
                       (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                        *)local_188);
            if ((_Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                 )local_188._0_8_ != (ConstPubkeyProvider *)0x0) {
              operator_delete((void *)local_188._0_8_,0x50);
            }
            (__return_storage_ptr__->
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start =
                 local_1a8.
                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (__return_storage_ptr__->
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish =
                 local_1a8.
                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_1a8.
                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar22 = (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                       *)&local_1a8;
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,"Uncompressed keys are not allowed");
          }
          goto LAB_003a016f;
        }
        if ((ctx != P2TR) ||
           (__src.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._1_7_ =
                 local_98._1_7_,
           __src.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ =
                local_98[0],
           (long)local_90._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl -
           (long)__src.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
           0x20)) {
LAB_003a034f:
          tinyformat::format<std::__cxx11::string>
                    ((string *)local_188,(tinyformat *)"Pubkey \'%s\' is invalid",(char *)&local_58,
                     pbVar17);
          _GLOBAL__N_1::ParsePubkeyInner();
          goto LAB_003a016f;
        }
        local_188._8_8_ = 0;
        local_188._16_8_ = 0;
        local_188[0x18] = '\0';
        local_188[0x19] = '\0';
        local_188[0x1a] = '\0';
        local_188[0x1b] = '\0';
        local_188[0x1c] = '\0';
        local_188[0x1d] = '\0';
        local_188[0x1e] = '\0';
        local_188[0x1f] = '\0';
        local_168 = '\0';
        local_188._0_8_ = (ConstPubkeyProvider *)0x2;
        if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             )local_90._M_t.
              super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
            (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)
            __src.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl) {
          memmove(local_188 + 1,
                  (void *)__src.
                          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                          _M_head_impl,0x20);
        }
        CPubKey::Set<unsigned_char*>((CPubKey *)&local_10c,local_188,local_167);
        bVar8 = CPubKey::IsFullyValid((CPubKey *)&local_10c);
        if (!bVar8) goto LAB_003a034f;
        pvVar15 = (pointer)operator_new(0x50);
        *(uint32_t *)
         &(pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = key_exp_index;
        (pvVar15->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__PubkeyProvider_006cbc10;
        memcpy((void *)((long)&(pvVar15->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish + 4),&local_10c,0x41);
        *(undefined1 *)
         ((long)&pvVar15[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + 5) = 1;
        local_1d8.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pvVar15;
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
        ::
        emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                  ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                    *)&local_1a8,
                   (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                    *)&local_1d8);
        if (local_1d8.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1d8.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,0x50);
        }
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start =
             local_1a8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish =
             local_1a8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1a8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1a8.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__;
        if (!bVar8) goto LAB_003a034f;
      }
      pvVar5 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,local_88[0]._M_allocated_capacity - (long)pvVar5);
      }
      goto LAB_003a02c2;
    }
    DecodeSecret((string *)local_98);
    if (local_90._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
        (_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )0x0) goto LAB_0039fc7e;
    this_00 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_90;
    if ((ctx < P2WPKH) || (local_98[0] == true)) {
      CKey::GetPubKey((CPubKey *)&local_10c,(CKey *)local_98);
      CPubKey::GetID((CKeyID *)local_188,(CPubKey *)&local_10c);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
      ::_M_emplace_unique<CKeyID,CKey&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                  *)&out->keys,(CKeyID *)local_188,(CKey *)local_98);
      tVar14.
      super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
      .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
            )operator_new(0x50);
      *(uint32_t *)
       ((long)tVar14.
              super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
              .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
              _M_head_impl + 8) = key_exp_index;
      *(undefined ***)
       tVar14.
       super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
       .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>._M_head_impl =
           &PTR__PubkeyProvider_006cbc10;
      memcpy((void *)((long)tVar14.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                            .
                            super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>
                            ._M_head_impl + 0xc),&local_10c,0x41);
      *(bool *)((long)tVar14.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                      _M_head_impl + 0x4d) = ctx == P2TR;
      local_188._0_8_ =
           tVar14.
           super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
           .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
      ::
      emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                  *)&local_1a8,
                 (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                  *)local_188);
      if ((_Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
           )local_188._0_8_ != (ConstPubkeyProvider *)0x0) {
        operator_delete((void *)local_188._0_8_,0x50);
      }
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           local_1a8.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           local_1a8.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1a8.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1a8.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (error,"Uncompressed keys are not allowed");
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )local_90._M_t.
          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )0x0) goto LAB_003a02c2;
  }
  else {
LAB_0039fc7e:
    DecodeExtKey((CExtKey *)local_98,&local_58);
    DecodeExtPubKey(&local_10c,&local_58);
    pSVar6 = local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((local_60._M_head_impl == (array<unsigned_char,_32UL> *)0x0) &&
        (pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)local_10c.pubkey.vch[0] & 0xfffffffffffffffe), (char)pbVar17 != '\x02'))
       && ((7 < local_10c.pubkey.vch[0] ||
           (pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd0,
           (0xd0U >> (local_10c.pubkey.vch[0] & 0x1f) & 1) == 0)))) {
      tinyformat::format<std::__cxx11::string>
                ((string *)local_188,(tinyformat *)"key \'%s\' is not valid",(char *)&local_58,
                 pbVar17);
      _GLOBAL__N_1::ParsePubkeyInner();
    }
    else {
      local_1d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __s1 = local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1].m_data;
      sVar1 = local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1].m_size;
      if ((sVar1 == 1) && (iVar10 = bcmp(__s1,"*",1), iVar10 == 0)) {
        local_1f4 = 1;
LAB_0039fd97:
        local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar6 + -1;
      }
      else {
        local_1f4 = 0;
        if ((sVar1 == 2) &&
           ((iVar10 = bcmp(__s1,"*\'",2), iVar10 == 0 || (iVar10 = bcmp(__s1,"*h",2), iVar10 == 0)))
           ) {
          iVar10 = bcmp(__s1,"*\'",2);
          *apostrophe = iVar10 == 0;
          local_1f4 = 2;
          goto LAB_0039fd97;
        }
      }
      bVar8 = ParseKeyPath(&local_1c0,&local_1d8,apostrophe,error,true);
      pvVar20 = __return_storage_ptr__;
      if (bVar8) {
        if (local_60._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
          CExtKey::Neuter((CExtPubKey *)local_188,(CExtKey *)local_98);
          puVar23 = (undefined4 *)local_188;
          pCVar24 = &local_10c;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(undefined4 *)pCVar24->version = *puVar23;
            puVar23 = puVar23 + (ulong)bVar9 * -2 + 1;
            pCVar24 = (CExtPubKey *)((long)pCVar24 + ((ulong)bVar9 * -2 + 1) * 4);
          }
          local_10c.pubkey.vch[0x40] = local_118;
          CPubKey::GetID((CKeyID *)local_188,&local_10c.pubkey);
          std::
          _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
          ::_M_emplace_unique<CKeyID,CKey&>
                    ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                      *)&out->keys,(CKeyID *)local_188,(CKey *)local_68);
        }
        pvVar15 = local_1d8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_1f0 = local_1a8.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if (local_1d8.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_1d8.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pvVar25 = local_1d8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            _Var11._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
            .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>._M_head_impl
                 = (tuple<(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                    )operator_new(0xa0);
            puVar7 = local_1a8.
                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pp_Var2 = (_func_int **)
                      (pvVar25->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            pp_Var3 = (_func_int **)
                      (pvVar25->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar4 = (pvVar25->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            (pvVar25->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pvVar25->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pvVar25->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar8 = *apostrophe;
            *(uint32_t *)
             ((long)_Var11._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                    _M_head_impl + 8) = key_exp_index;
            *(undefined ***)
             _Var11._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
             .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
             _M_head_impl = &PTR__BIP32PubkeyProvider_006cbd18;
            pCVar24 = &local_10c;
            puVar23 = (undefined4 *)
                      ((long)_Var11._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>
                             ._M_head_impl + 0xc);
            for (lVar18 = 0x1d; lVar18 != 0; lVar18 = lVar18 + -1) {
              *puVar23 = *(undefined4 *)pCVar24->version;
              pCVar24 = (CExtPubKey *)((long)pCVar24 + ((ulong)bVar9 * -2 + 1) * 4);
              puVar23 = puVar23 + (ulong)bVar9 * -2 + 1;
            }
            ((PubkeyProvider *)
            ((long)_Var11._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                   _M_head_impl + 0x80))->_vptr_PubkeyProvider = pp_Var3;
            *(pointer *)
             &((PubkeyProvider *)
              ((long)_Var11._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                     _M_head_impl + 0x80))->m_expr_index = puVar4;
            ((PubkeyProvider *)
            ((long)_Var11._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                   _M_head_impl + 0x90))->_vptr_PubkeyProvider = pp_Var2;
            ((PubkeyProvider *)
            ((long)_Var11._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                   _M_head_impl + 0x90))->m_expr_index = local_1f4;
            ((PubkeyProvider *)
            ((long)_Var11._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                   _M_head_impl + 0x90))->field_0xc = bVar8;
            if (local_1a8.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_1a8.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              lVar18 = (long)local_1a8.
                             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)local_1f0;
              local_188._0_8_ =
                   _Var11._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                   _M_head_impl;
              if (lVar18 == 0x7ffffffffffffff8) {
                local_1a8.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = local_1f0;
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  uVar16 = std::__throw_length_error("vector::_M_realloc_insert");
                  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                       )local_60._M_head_impl !=
                      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
                    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_60,
                               local_60._M_head_impl);
                  }
                  local_60._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    local_58.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1c0.
                      super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_1c0.
                                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1c0.
                                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1c0.
                                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ::~vector(&local_1a8);
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    _Unwind_Resume(uVar16);
                  }
                }
                goto LAB_003a0617;
              }
              uVar12 = lVar18 >> 3;
              uVar19 = uVar12;
              if (local_1a8.
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish == local_1f0) {
                uVar19 = 1;
              }
              this = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      *)(uVar19 + uVar12);
              if ((_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                   *)0xffffffffffffffe < this) {
                this = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        *)0xfffffffffffffff;
              }
              if (CARRY8(uVar19,uVar12)) {
                this = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        *)0xfffffffffffffff;
              }
              puVar13 = std::
                        _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ::_M_allocate(this,0xfffffffffffffff);
              local_188._0_8_ = (ConstPubkeyProvider *)0x0;
              ((__uniq_ptr_impl<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                *)((long)puVar13 + lVar18))->_M_t =
                   _Var11._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                   _M_head_impl;
              puVar26 = puVar13;
              for (puVar21 = local_1f0; puVar7 != puVar21; puVar21 = puVar21 + 1) {
                (puVar26->_M_t).
                super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl
                     = (puVar21->_M_t).
                       super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                       _M_head_impl;
                (puVar21->_M_t).
                super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl
                     = (PubkeyProvider *)0x0;
                puVar26 = puVar26 + 1;
              }
              if (local_1f0 != (pointer)0x0) {
                operator_delete(local_1f0,
                                (long)local_1a8.
                                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1f0);
              }
              local_1a8.
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar13 + (long)this;
              local_1f0 = puVar13;
            }
            else {
              local_188._0_8_ =
                   (_Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                    )0x0;
              ((local_1a8.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
              super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
                   (PubkeyProvider *)
                   _Var11._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::ConstPubkeyProvider_*,_false>.
                   _M_head_impl;
              puVar26 = local_1a8.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            local_1a8.
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = puVar26 + 1;
            std::
            unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
                           *)local_188);
            pvVar25 = pvVar25 + 1;
          } while (pvVar25 != pvVar15);
        }
        pvVar20 = &local_1a8;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = local_1f0;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish =
             local_1a8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1a8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1a8.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_1f0;
      }
      (pvVar20->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar20->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar20->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_1d8);
    }
    if (local_60._M_head_impl == (array<unsigned_char,_32UL> *)0x0) goto LAB_003a02c2;
    this_00 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_60;
    local_90._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )(tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )local_60;
  }
  SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
            (this_00,(array<unsigned_char,_32UL> *)
                     local_90._M_t.
                     super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                     .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
LAB_003a02c2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_1c0.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003a0617:
  __stack_chk_fail();
}

Assistant:

std::vector<std::unique_ptr<PubkeyProvider>> ParsePubkeyInner(uint32_t key_exp_index, const Span<const char>& sp, ParseScriptContext ctx, FlatSigningProvider& out, bool& apostrophe, std::string& error)
{
    std::vector<std::unique_ptr<PubkeyProvider>> ret;
    bool permit_uncompressed = ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH;
    auto split = Split(sp, '/');
    std::string str(split[0].begin(), split[0].end());
    if (str.size() == 0) {
        error = "No key provided";
        return {};
    }
    if (split.size() == 1) {
        if (IsHex(str)) {
            std::vector<unsigned char> data = ParseHex(str);
            CPubKey pubkey(data);
            if (pubkey.IsValid() && !pubkey.IsValidNonHybrid()) {
                error = "Hybrid public keys are not allowed";
                return {};
            }
            if (pubkey.IsFullyValid()) {
                if (permit_uncompressed || pubkey.IsCompressed()) {
                    ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, false));
                    return ret;
                } else {
                    error = "Uncompressed keys are not allowed";
                    return {};
                }
            } else if (data.size() == 32 && ctx == ParseScriptContext::P2TR) {
                unsigned char fullkey[33] = {0x02};
                std::copy(data.begin(), data.end(), fullkey + 1);
                pubkey.Set(std::begin(fullkey), std::end(fullkey));
                if (pubkey.IsFullyValid()) {
                    ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, true));
                    return ret;
                }
            }
            error = strprintf("Pubkey '%s' is invalid", str);
            return {};
        }
        CKey key = DecodeSecret(str);
        if (key.IsValid()) {
            if (permit_uncompressed || key.IsCompressed()) {
                CPubKey pubkey = key.GetPubKey();
                out.keys.emplace(pubkey.GetID(), key);
                ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, ctx == ParseScriptContext::P2TR));
                return ret;
            } else {
                error = "Uncompressed keys are not allowed";
                return {};
            }
        }
    }
    CExtKey extkey = DecodeExtKey(str);
    CExtPubKey extpubkey = DecodeExtPubKey(str);
    if (!extkey.key.IsValid() && !extpubkey.pubkey.IsValid()) {
        error = strprintf("key '%s' is not valid", str);
        return {};
    }
    std::vector<KeyPath> paths;
    DeriveType type = DeriveType::NO;
    if (std::ranges::equal(split.back(), Span{"*"}.first(1))) {
        split.pop_back();
        type = DeriveType::UNHARDENED;
    } else if (std::ranges::equal(split.back(), Span{"*'"}.first(2)) || std::ranges::equal(split.back(), Span{"*h"}.first(2))) {
        apostrophe = std::ranges::equal(split.back(), Span{"*'"}.first(2));
        split.pop_back();
        type = DeriveType::HARDENED;
    }
    if (!ParseKeyPath(split, paths, apostrophe, error, /*allow_multipath=*/true)) return {};
    if (extkey.key.IsValid()) {
        extpubkey = extkey.Neuter();
        out.keys.emplace(extpubkey.pubkey.GetID(), extkey.key);
    }
    for (auto& path : paths) {
        ret.emplace_back(std::make_unique<BIP32PubkeyProvider>(key_exp_index, extpubkey, std::move(path), type, apostrophe));
    }
    return ret;
}